

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurredsegment.cpp
# Opt level: O3

Pt2i __thiscall BlurredSegment::getMiddle(BlurredSegment *this)

{
  long lVar1;
  long in_RSI;
  long lVar2;
  Pt2i lp;
  Pt2i rp;
  Pt2i local_28;
  Pt2i local_20;
  
  lVar1 = *(long *)(in_RSI + 8);
  lVar2 = *(long *)(lVar1 + 0x30);
  if (lVar2 == *(long *)(lVar1 + 0x38)) {
    lVar2 = *(long *)(*(long *)(lVar1 + 0x48) + -8) + 0x200;
  }
  Pt2i::Pt2i(&local_20,(Pt2i *)(lVar2 + -8));
  Pt2i::Pt2i(&local_28,*(Pt2i **)(*(long *)(in_RSI + 8) + 0x10));
  Pt2i::Pt2i((Pt2i *)this,(local_28.xp + local_20.xp) / 2,(local_28.yp + local_20.yp) / 2);
  return (Pt2i)this;
}

Assistant:

const Pt2i BlurredSegment::getMiddle () const
{
  Pt2i rp = plist->backPoint ();
  Pt2i lp = plist->frontPoint ();
  return (Pt2i ((rp.x () + lp.x ()) / 2, (rp.y () + lp.y ()) / 2));
}